

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O2

AliHttpRequest * __thiscall
AliHttpRequest::AddRequestQuery(AliHttpRequest *this,string *field,string *value)

{
  string sStack_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if ((this->query_)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&this->query_);
  }
  std::__cxx11::string::string((string *)&local_48,(string *)field);
  urlencode(&local_68,&local_48);
  std::__cxx11::string::string((string *)&sStack_a8,(string *)value);
  urlencode(&local_88,&sStack_a8);
  append_format_string(&this->query_,"%s=%s",local_68._M_dataplus._M_p,local_88._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return this;
}

Assistant:

AliHttpRequest& AliHttpRequest::AddRequestQuery(std::string field, std::string value) {
  if(!this->query_.empty()) {
    query_.append("&");
  }
  append_format_string(query_, "%s=%s", urlencode(field).c_str(),  urlencode(value).c_str());
  return *this;
}